

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (BiDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  LSTMParams *value;
  ActivationParams *value_00;
  LSTMWeightParams *value_01;
  char cVar7;
  ulong uVar8;
  uint64 *value_02;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_00;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_00512b4f;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_00512b4f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_00512a65:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar5 != 0x14) {
        if (uVar5 == 2) {
          value_02 = &this->outputvectorsize_;
          if (cVar7 == '\x10') {
LAB_00512b21:
            bVar4 = google::protobuf::io::CodedInputStream::ReadVarint64(input,value_02);
            goto LAB_00512a85;
          }
        }
        else if (uVar5 == 10) {
          this_00 = &this->activationsforwardlstm_;
          if (cVar7 == 'R') {
LAB_00512afc:
            value_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::
                       Add(this_00);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::ActivationParams>(input,value_00);
            goto LAB_00512a85;
          }
        }
        else if (uVar5 == 0xb) {
          this_00 = &this->activationsbackwardlstm_;
          if (cVar7 == 'Z') goto LAB_00512afc;
        }
        else if (uVar5 == 0xf) {
          if (cVar7 == 'z') {
            value = mutable_params(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::LSTMParams>(input,value);
            goto LAB_00512a85;
          }
        }
        else if ((uVar5 == 1) && (value_02 = &this->inputvectorsize_, cVar7 == '\b'))
        goto LAB_00512b21;
        goto LAB_00512a65;
      }
      if (cVar7 != -0x5e) goto LAB_00512a65;
      value_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::Add
                           (&this->weightparams_);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::LSTMWeightParams>(input,value_01);
    }
LAB_00512a85:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool BiDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsforwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsbackwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return false;
#undef DO_
}